

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v11::detail::bigint::remove_leading_zeros(bigint *this)

{
  int iVar1;
  int iVar2;
  make_unsigned_t<int> mVar3;
  ulong uVar4;
  uint *puVar5;
  int value;
  
  uVar4 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar1 = 1;
  if ((int)uVar4 < 1) {
    iVar1 = (int)uVar4;
  }
  puVar5 = (this->bigits_).super_buffer<unsigned_int>.ptr_ + (uVar4 & 0xffffffff);
  do {
    puVar5 = puVar5 + -1;
    iVar2 = (int)uVar4;
    value = iVar1;
    if (iVar2 < 2) break;
    uVar4 = (ulong)(iVar2 - 1);
    value = iVar2;
  } while (*puVar5 == 0);
  mVar3 = to_unsigned<int>(value);
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)mVar3);
  return;
}

Assistant:

FMT_CONSTEXPR void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }